

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void colEchelonForm(MatrixXd *M,list<int,_std::allocator<int>_> *b)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  RealScalar RVar17;
  double dVar18;
  uint local_f8;
  uint local_f4;
  double local_f0;
  double *local_e8;
  long local_e0;
  long local_d8;
  MatrixXd *local_d0;
  double *local_c8;
  long local_c0;
  long local_b8;
  MatrixXd *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  double *local_88;
  long local_80;
  undefined8 local_78;
  MatrixXd *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  list<int,_std::allocator<int>_> *local_48;
  double local_40;
  ulong local_38;
  
  lVar6 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar9 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_f8 = 0;
  iVar12 = (int)uVar9;
  iVar5 = (int)lVar6;
  if (lVar6 < (long)uVar9) {
    iVar5 = iVar12;
  }
  local_f0 = (double)iVar5 * 2.2204e-16;
  RVar17 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>::run
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)M);
  local_40 = RVar17 * local_f0;
  local_48 = b;
  std::__cxx11::list<int,_std::allocator<int>_>::clear(b);
  uVar7 = 0;
  uVar16 = 0;
  if (0 < iVar12) {
    uVar16 = uVar9 & 0xffffffff;
  }
  local_f4 = 0;
  local_50 = lVar6;
  local_38 = uVar9;
  while ((iVar5 = (int)local_38 - local_f4, iVar5 != 0 && (int)local_f4 <= (int)local_38 &&
         (iVar14 = (int)lVar6, (int)uVar7 < iVar14))) {
    pdVar8 = (double *)(long)(int)uVar7;
    pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar2 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    lVar13 = (long)(int)local_f4;
    pdVar10 = (double *)(lVar2 * 8 * lVar13 + (long)pdVar8 * 8 + (long)pdVar1);
    dVar18 = 2.2250738585072014e-308;
    uVar7 = local_f4;
    for (lVar11 = lVar13; lVar11 < iVar12; lVar11 = lVar11 + 1) {
      dVar3 = ABS(*pdVar10);
      uVar4 = (uint)lVar11;
      if (ABS(*pdVar10) <= dVar18) {
        dVar3 = dVar18;
        uVar4 = uVar7;
      }
      uVar7 = uVar4;
      dVar18 = dVar3;
      pdVar10 = pdVar10 + lVar2;
    }
    if (local_40 <= dVar18) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (local_48,(value_type_conflict1 *)&local_f8);
      local_f0 = (double)(long)iVar14;
      if (uVar7 != local_f4) {
        local_c8 = (double *)(long)(int)local_f8;
        local_e0 = (long)local_f0 - (long)local_c8;
        local_88 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data;
        local_b8 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows;
        local_e8 = local_88 + (long)local_c8 + local_b8 * lVar13;
        local_d8 = 1;
        local_60 = (ulong)(int)uVar7;
        local_88 = local_88 + (long)local_c8 + local_b8 * local_60;
        local_78 = 1;
        local_d0 = M;
        local_c0 = lVar13;
        local_80 = local_e0;
        local_70 = M;
        local_68 = (long)local_c8;
        local_58 = local_b8;
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        swap<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                  ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &local_e8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)&local_88);
      }
      lVar6 = (long)(int)local_f8;
      local_b8 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
      pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      local_e0 = (long)(int)(~local_f8 + iVar14);
      local_e8 = pdVar1 + local_b8 * lVar13 + lVar6 + 1;
      local_c8 = (double *)(lVar6 + 1);
      local_d8 = 1;
      local_d0 = M;
      local_c0 = lVar13;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_e8,pdVar1 + local_b8 * lVar13 + lVar6);
      (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [(M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows *
       lVar13 + (long)(int)local_f8] = 1.0;
      uVar9 = (ulong)local_f4;
      for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
        if (uVar9 != uVar15) {
          local_a8 = (long)(int)local_f8;
          local_88 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
          local_98 = (M->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_rows;
          local_e0 = (long)local_f0 - local_a8;
          local_c8 = local_88 + local_a8 + local_98 * lVar13;
          local_d0 = (MatrixXd *)local_88[local_98 * uVar15 + local_a8];
          local_d8 = 1;
          local_b8 = 1;
          local_88 = local_88 + local_a8 + local_98 * uVar15;
          local_78 = 1;
          local_c0 = local_e0;
          local_b0 = M;
          local_a0 = lVar13;
          local_80 = local_e0;
          local_70 = M;
          local_68 = local_a8;
          local_60 = uVar15;
          local_58 = local_98;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          operator-=((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_88,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                      *)&local_e8);
        }
      }
      local_f4 = local_f4 + 1;
      lVar6 = local_50;
    }
    else {
      local_d8 = (long)iVar5;
      local_e8 = pdVar1 + (long)((long)pdVar8 + lVar2 * lVar13);
      local_e0 = 1;
      local_d0 = M;
      local_c8 = pdVar8;
      local_c0 = lVar13;
      local_b8 = lVar2;
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_e8);
    }
    uVar7 = local_f8 + 1;
    local_f8 = uVar7;
  }
  return;
}

Assistant:

void colEchelonForm(Eigen::MatrixXd &M, std::list<int> &b)
{
	int n = M.rows();
	int m = M.cols();
	int i = 0, j = 0, k = 0;
	int col = 0;
	double p, tp;

	int maxmn = (M.cols()<M.rows()) ? M.rows() : M.cols();

	double pivtol = 2.2204e-16*maxmn*M.lpNorm<Eigen::Infinity>();

	b.clear();

	while ((i < m) && (j < n))
	{
		p = DBL_MIN;
		col = i;
		for (k = i; k < m; k++)
		{
			tp = std::abs(M(j, k));
			if (tp > p)
			{
				p = tp;
				col = k;
			}
		}

		if (p < pivtol)
		{
			M.block(j, i, 1, m - i).setZero();
			j++;
		}
		else
		{
			b.push_back(j);

			if (col != i)
				M.block(j, i, n - j, 1).swap(M.block(j, col, n - j, 1));

			M.block(j + 1, i, n - j - 1, 1) /= M(j, i);
			M(j, i) = 1.0;

			for (k = 0; k < m; k++)
			{
				if (k == i)
					continue;

				M.block(j, k, n - j, 1) -= M(j, k) * M.block(j, i, n - j, 1);
			}

			i++;
			j++;
		}
	}
}